

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_mutex * pthreadMutexAlloc(int iType)

{
  pthread_mutexattr_t local_1c;
  pthread_mutex_t *ppStack_18;
  pthread_mutexattr_t recursiveAttr;
  sqlite3_mutex *p;
  int iType_local;
  
  p._4_4_ = iType;
  if (iType == 0) {
    ppStack_18 = (pthread_mutex_t *)sqlite3MallocZero(0x28);
    if (ppStack_18 != (pthread_mutex_t *)0x0) {
      pthread_mutex_init(ppStack_18,(pthread_mutexattr_t *)0x0);
    }
  }
  else if (iType == 1) {
    ppStack_18 = (pthread_mutex_t *)sqlite3MallocZero(0x28);
    if (ppStack_18 != (pthread_mutex_t *)0x0) {
      pthread_mutexattr_init(&local_1c);
      pthread_mutexattr_settype(&local_1c,1);
      pthread_mutex_init(ppStack_18,&local_1c);
      pthread_mutexattr_destroy(&local_1c);
    }
  }
  else {
    ppStack_18 = (pthread_mutex_t *)(pthreadMutexAlloc::staticMutexes + (iType + -2));
  }
  return (sqlite3_mutex *)ppStack_18;
}

Assistant:

static sqlite3_mutex *pthreadMutexAlloc(int iType){
  static sqlite3_mutex staticMutexes[] = {
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER
  };
  sqlite3_mutex *p;
  switch( iType ){
    case SQLITE_MUTEX_RECURSIVE: {
      p = sqlite3MallocZero( sizeof(*p) );
      if( p ){
#ifdef SQLITE_HOMEGROWN_RECURSIVE_MUTEX
        /* If recursive mutexes are not available, we will have to
        ** build our own.  See below. */
        pthread_mutex_init(&p->mutex, 0);
#else
        /* Use a recursive mutex if it is available */
        pthread_mutexattr_t recursiveAttr;
        pthread_mutexattr_init(&recursiveAttr);
        pthread_mutexattr_settype(&recursiveAttr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&p->mutex, &recursiveAttr);
        pthread_mutexattr_destroy(&recursiveAttr);
#endif
      }
      break;
    }
    case SQLITE_MUTEX_FAST: {
      p = sqlite3MallocZero( sizeof(*p) );
      if( p ){
        pthread_mutex_init(&p->mutex, 0);
      }
      break;
    }
    default: {
#ifdef SQLITE_ENABLE_API_ARMOR
      if( iType-2<0 || iType-2>=ArraySize(staticMutexes) ){
        (void)SQLITE_MISUSE_BKPT;
        return 0;
      }
#endif
      p = &staticMutexes[iType-2];
      break;
    }
  }
#if SQLITE_MUTEX_NREF || defined(SQLITE_ENABLE_API_ARMOR)
  if( p ) p->id = iType;
#endif
  return p;
}